

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recog_intel.c
# Opt level: O0

cpu_epc_t cpuid_get_epc(int index,cpu_raw_data_t *raw)

{
  cpu_epc_t cVar1;
  undefined8 *puVar2;
  undefined8 local_38;
  uint32_t regs [4];
  cpu_raw_data_t *raw_local;
  ulong uStack_18;
  int index_local;
  cpu_epc_t retval;
  
  regs._8_8_ = raw;
  memset(&stack0xffffffffffffffe8,0,0x10);
  if ((regs._8_8_ == 0) || (1 < index)) {
    regs[1] = 0;
    regs[0] = index + 2;
    local_38 = 0x12;
    cpu_exec_cpuid_ext((uint32_t *)&local_38);
  }
  else {
    puVar2 = (undefined8 *)(regs._8_8_ + 0x4c0 + (long)(index + 2) * 0x10);
    local_38 = *puVar2;
    regs._0_8_ = puVar2[1];
  }
  if (((uint)local_38 & 0xf) == 1) {
    uStack_18 = (ulong)(local_38._4_4_ & 0xfffff) << 0x20 | (uint)local_38 & 0xfffff000 | uStack_18;
    retval.start_addr =
         (ulong)(regs[1] & 0xfffff) << 0x20 | regs[0] & 0xfffff000 | retval.start_addr;
  }
  cVar1.length = retval.start_addr;
  cVar1.start_addr = uStack_18;
  return cVar1;
}

Assistant:

struct cpu_epc_t cpuid_get_epc(int index, const struct cpu_raw_data_t* raw)
{
	uint32_t regs[4];
	struct cpu_epc_t retval = {0, 0};
	if (raw && index < MAX_INTELFN12H_LEVEL - 2) {
		// this was queried already, use the data:
		memcpy(regs, raw->intel_fn12h[2 + index], sizeof(regs));
	} else {
		// query this ourselves:
		regs[0] = 0x12;
		regs[2] = 2 + index;
		regs[1] = regs[3] = 0;
		cpu_exec_cpuid_ext(regs);
	}

	// decode values:
	if ((regs[0] & 0xf) == 0x1) {
		retval.start_addr |= (regs[0] & 0xfffff000); // bits [12, 32) -> bits [12, 32)
		retval.start_addr |= ((uint64_t) (regs[1] & 0x000fffff)) << 32; // bits [0, 20) -> bits [32, 52)
		retval.length     |= (regs[2] & 0xfffff000); // bits [12, 32) -> bits [12, 32)
		retval.length     |= ((uint64_t) (regs[3] & 0x000fffff)) << 32; // bits [0, 20) -> bits [32, 52)
	}
	return retval;
}